

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int dh_flag,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi_sint mStack_60;
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  
  if (nbits - 0x2001 < 0xffffffffffffe002) {
    return -4;
  }
  Y.s = 1;
  Y.n = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  iVar3 = mbedtls_mpi_fill_random
                    (X,(((nbits >> 6) + 1) - (ulong)((nbits & 0x3f) == 0)) * 8,f_rng,p_rng);
  if (iVar3 != 0) goto LAB_00150b72;
  sVar4 = mbedtls_mpi_bitlen(X);
  if ((nbits <= sVar4 && sVar4 - nbits != 0) &&
     (iVar3 = mbedtls_mpi_shift_r(X,(sVar4 - nbits) + 1), iVar3 != 0)) goto LAB_00150b72;
  mbedtls_mpi_set_bit(X,nbits - 1,'\x01');
  puVar1 = X->p;
  uVar2 = *puVar1;
  *puVar1 = uVar2 | 1;
  if (dh_flag == 0) {
    do {
      iVar3 = mbedtls_mpi_is_prime(X,f_rng,p_rng);
      if (iVar3 != -0xe) break;
      iVar3 = mbedtls_mpi_add_int(X,X,2);
    } while (iVar3 == 0);
    goto LAB_00150b72;
  }
  *puVar1 = uVar2 | 3;
  iVar3 = mbedtls_mpi_mod_int(&r,X,3);
  if (iVar3 != 0) goto LAB_00150b72;
  if (r == 1) {
    mStack_60 = 4;
LAB_00150c36:
    iVar3 = mbedtls_mpi_add_int(X,X,mStack_60);
    if (iVar3 != 0) goto LAB_00150b72;
  }
  else if (r == 0) {
    mStack_60 = 8;
    goto LAB_00150c36;
  }
  iVar3 = mbedtls_mpi_copy(&Y,X);
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_shift_r(&Y,1), iVar3 == 0)) {
    do {
      iVar3 = mpi_check_small_factors(X);
      if (((iVar3 == 0) && (iVar3 = mpi_check_small_factors(&Y), iVar3 == 0)) &&
         (iVar3 = mpi_miller_rabin(X,f_rng,p_rng), iVar3 == 0)) {
        iVar3 = mpi_miller_rabin(&Y,f_rng,p_rng);
      }
    } while (((iVar3 == -0xe) && (iVar3 = mbedtls_mpi_add_int(X,X,0xc), iVar3 == 0)) &&
            (iVar3 = mbedtls_mpi_add_int(&Y,&Y,6), iVar3 == 0));
  }
LAB_00150b72:
  mbedtls_mpi_free(&Y);
  return iVar3;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int dh_flag,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
    int ret;
    size_t k, n;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );

    k = mbedtls_mpi_bitlen( X );
    if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits + 1 ) );

    mbedtls_mpi_set_bit( X, nbits-1, 1 );

    X->p[0] |= 1;

    if( dh_flag == 0 )
    {
        while( ( ret = mbedtls_mpi_is_prime( X, f_rng, p_rng ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 2 ) );
        }
    }
    else
    {
        /*
         * An necessary condition for Y and X = 2Y + 1 to be prime
         * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
         * Make sure it is satisfied, while keeping X = 3 mod 4
         */

        X->p[0] |= 2;

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
        if( r == 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
        else if( r == 1 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

        /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

        while( 1 )
        {
            /*
             * First, check small factors for X and Y
             * before doing Miller-Rabin on any of them
             */
            if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                ( ret = mpi_miller_rabin(  X, f_rng, p_rng  ) ) == 0 &&
                ( ret = mpi_miller_rabin( &Y, f_rng, p_rng  ) ) == 0 )
            {
                break;
            }

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;

            /*
             * Next candidates. We want to preserve Y = (X-1) / 2 and
             * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
             * so up Y by 6 and X by 12.
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}